

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

void __thiscall ParserTestBackslash::Run(ParserTestBackslash *this)

{
  int iVar1;
  Test *pTVar2;
  bool bVar3;
  BindingEnv *this_00;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  iVar1 = g_current_test->assertion_failures_;
  ParserTest::AssertParse(&this->super_ParserTest,"foo = bar\\baz\nfoo2 = bar\\ baz\n");
  pTVar2 = g_current_test;
  if (iVar1 == g_current_test->assertion_failures_) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"foo",&local_61);
    this_00 = &(this->super_ParserTest).state.bindings_;
    BindingEnv::LookupVariable(&local_40,this_00,&local_60);
    bVar3 = std::operator==("bar\\baz",&local_40);
    testing::Test::Check
              (pTVar2,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
               ,0xd0,"\"bar\\\\baz\" == state.bindings_.LookupVariable(\"foo\")");
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    pTVar2 = g_current_test;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"foo2",&local_61);
    BindingEnv::LookupVariable(&local_40,this_00,&local_60);
    bVar3 = std::operator==("bar\\ baz",&local_40);
    testing::Test::Check
              (pTVar2,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
               ,0xd1,"\"bar\\\\ baz\" == state.bindings_.LookupVariable(\"foo2\")");
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(ParserTest, Backslash) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"foo = bar\\baz\n"
"foo2 = bar\\ baz\n"
));
  EXPECT_EQ("bar\\baz", state.bindings_.LookupVariable("foo"));
  EXPECT_EQ("bar\\ baz", state.bindings_.LookupVariable("foo2"));
}